

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void greet_prog_tower_shopkeeper(CHAR_DATA *mob,CHAR_DATA *ch)

{
  bool bVar1;
  allocator<char> local_112;
  allocator<char> local_111;
  CHAR_DATA *mob_local;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  AFFECT_DATA af;
  
  mob_local = mob;
  bVar1 = is_affected(mob,(int)gsn_bash);
  if (!bVar1) {
    bVar1 = is_npc(ch);
    if (!bVar1) {
      init_affect(&af);
      af.where = 0;
      af.type = gsn_bash;
      af.duration = -1;
      affect_to_char(mob,&af);
      act("$N glances over his shoulder at $n and grumbles.",ch,(void *)0x0,mob,0);
      act("$n glances over his shoulder at you and grumbles.",mob,(void *)0x0,ch,2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"greet_prog_tower_shopkeeper",&local_111);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"do_say_queue",&local_112);
      CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[90]>
                (&RS.Queue,4,&local_a8,&local_c8,do_say_queue,&mob_local,
                 (char (*) [90])
                 "Well,  are ye goin\' to buy somethin\' or are ye just going t\'stand there and stare at me!?"
                );
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"greet_prog_tower_shopkeeper",&local_111);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"do_astrip_queue",&local_112);
      CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[1]>
                (&RS.Queue,0x18,&local_e8,&local_108,do_astrip_queue,&mob_local,
                 (char (*) [1])0x3dff64);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
    }
  }
  return;
}

Assistant:

void greet_prog_tower_shopkeeper(CHAR_DATA *mob, CHAR_DATA *ch)
{
	AFFECT_DATA af;

	if (is_affected(mob, gsn_bash))
		return;

	if (is_npc(ch))
		return;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_bash;
	af.duration = -1;

	affect_to_char(mob, &af);

	act("$N glances over his shoulder at $n and grumbles.", ch, 0, mob, TO_ROOM);
	act("$n glances over his shoulder at you and grumbles.", mob, 0, ch, TO_VICT);
	RS.Queue.AddToQueue(4, "greet_prog_tower_shopkeeper", "do_say_queue", do_say_queue, mob, "Well,  are ye goin' to buy somethin' or are ye just going t'stand there and stare at me!?");
	RS.Queue.AddToQueue(24, "greet_prog_tower_shopkeeper", "do_astrip_queue", do_astrip_queue, mob, "");
}